

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::OneHotEncoder::SerializeWithCachedSizes
          (OneHotEncoder *this,CodedOutputStream *output)

{
  uint32 uVar1;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->CategoryType_).stringcategories_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 2) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->CategoryType_).stringcategories_)->super_MessageLite,output);
  }
  if (this->outputsparse_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(10,true,output);
  }
  if (this->handleunknown_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(0xb,this->handleunknown_,output);
    return;
  }
  return;
}

Assistant:

void OneHotEncoder::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.OneHotEncoder)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.StringVector stringCategories = 1;
  if (has_stringcategories()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *CategoryType_.stringcategories_, output);
  }

  // .CoreML.Specification.Int64Vector int64Categories = 2;
  if (has_int64categories()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *CategoryType_.int64categories_, output);
  }

  // bool outputSparse = 10;
  if (this->outputsparse() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->outputsparse(), output);
  }

  // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
  if (this->handleunknown() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      11, this->handleunknown(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.OneHotEncoder)
}